

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtCofactorPerm(word *pTruth,int i,int nWords,int fSwapOnly,char *pCanonPerm,
                      uint *puCanonPhase,int fNaive)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  
  bVar6 = (byte)i;
  if (fSwapOnly == 0) {
    Abc_TtCopy(Abc_TtCofactorPerm::pCopy1,pTruth,nWords,0);
    iVar7 = 0;
    uVar5 = Abc_TtCofactorPermConfig(pTruth,i,nWords,0,fNaive);
    if (uVar5 != 0) {
      iVar4 = Abc_TtCompareRev(pTruth,Abc_TtCofactorPerm::pCopy1,nWords);
      if (iVar4 != 1) {
        if ((uVar5 & 1) != 0) {
          *puCanonPhase = *puCanonPhase ^ 1 << (bVar6 & 0x1f);
        }
        if ((uVar5 & 2) != 0) {
          *puCanonPhase = *puCanonPhase ^ 1 << (bVar6 + 1 & 0x1f);
        }
        if ((uVar5 & 4) == 0) {
          return uVar5;
        }
        uVar3 = *puCanonPhase;
        lVar8 = (long)i;
        lVar1 = lVar8 + 1;
        if (((uVar3 >> ((byte)lVar1 & 0x1f) ^ uVar3 >> (bVar6 & 0x1f)) & 1) != 0) {
          *puCanonPhase = uVar3 ^ 3 << (bVar6 & 0x1f);
        }
        cVar2 = pCanonPerm[lVar8];
        pCanonPerm[lVar8] = pCanonPerm[lVar1];
        pCanonPerm[lVar1] = cVar2;
        return uVar5;
      }
      Abc_TtCopy(pTruth,Abc_TtCofactorPerm::pCopy1,nWords,iVar7);
    }
    iVar7 = 0;
  }
  else {
    iVar4 = Abc_TtCofactorPermConfig(pTruth,i,nWords,1,0);
    iVar7 = 0;
    if (iVar4 != 0) {
      uVar5 = *puCanonPhase;
      lVar8 = (long)i;
      lVar1 = lVar8 + 1;
      if (((uVar5 >> ((byte)lVar1 & 0x1f) ^ uVar5 >> (bVar6 & 0x1f)) & 1) != 0) {
        *puCanonPhase = uVar5 ^ 3 << (bVar6 & 0x1f);
      }
      cVar2 = pCanonPerm[lVar8];
      pCanonPerm[lVar8] = pCanonPerm[lVar1];
      pCanonPerm[lVar1] = cVar2;
      iVar7 = iVar4;
    }
  }
  return iVar7;
}

Assistant:

int Abc_TtCofactorPerm( word * pTruth, int i, int nWords, int fSwapOnly, char * pCanonPerm, unsigned * puCanonPhase, int fNaive )
{
    if ( fSwapOnly )
    {
        int Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 1, 0 );
        if ( Config )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
    {
        static word pCopy1[1024];
        int Config;
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 0, fNaive );
        if ( Config == 0 )
            return 0;
        if ( Abc_TtCompareRev(pTruth, pCopy1, nWords) == 1 ) // made it worse
        {
            Abc_TtCopy( pTruth, pCopy1, nWords, 0 );
            return 0;
        }
        // improved
        if ( Config & 1 )
            *puCanonPhase ^= (1 << i);
        if ( Config & 2 )
            *puCanonPhase ^= (1 << (i+1));
        if ( Config & 4 )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
}